

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

int Parser::init(EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  istream *piVar5;
  size_type sVar6;
  mapped_type *__k;
  mapped_type *__args;
  size_type sVar7;
  reference pvVar8;
  int local_2e0;
  allocator local_2d9;
  int i;
  bool local_2b1;
  string local_2b0 [32];
  int local_290;
  bool local_289;
  string local_288 [32];
  int local_268;
  int local_264;
  int nowMid;
  int stat;
  Rule nowRule;
  string nowString;
  string local_218 [8];
  ifstream in;
  string *fileName_local;
  
  getEnds();
  std::ifstream::ifstream(local_218);
  std::ifstream::open(local_218,(_Ios_Openmode)ctx);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"open ");
    poVar4 = std::operator<<(poVar4,(string *)ctx);
    poVar4 = std::operator<<(poVar4," wrong");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::__cxx11::string::string
              ((string *)
               &nowRule.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    Rule::Rule((Rule *)&nowMid);
    local_264 = 0;
    local_268 = 0;
    while( true ) {
      piVar5 = std::operator>>((istream *)local_218,
                               (string *)
                               &nowRule.rights.
                                super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar2) break;
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &nowRule.rights.
                               super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,"#");
      if (bVar2) {
        local_264 = 0;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&nowRule.rights.
                                  super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,"->");
        if (bVar2) {
          local_264 = 1;
        }
        else if (local_264 == 0) {
          std::__cxx11::string::string
                    (local_288,
                     (string *)
                     &nowRule.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_268 = addMid((string *)local_288);
          std::__cxx11::string::~string(local_288);
        }
        else {
          bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&nowRule.rights.
                                      super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"$");
          if (bVar2) {
            sVar6 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)endTran_abi_cxx11_,
                            (key_type *)
                            &nowRule.rights.
                             super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage);
            if (sVar6 == 0) {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&nowRule.rights.
                                          super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,"none")
              ;
              if (bVar2) {
                pvVar8 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                                   ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,
                                    (long)local_268);
                pvVar8->canNone = true;
              }
              else {
                std::__cxx11::string::string
                          (local_2b0,
                           (string *)
                           &nowRule.rights.
                            super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
                local_290 = addMid((string *)local_2b0);
                local_2b1 = false;
                std::vector<Parser::Node,std::allocator<Parser::Node>>::emplace_back<int,bool>
                          ((vector<Parser::Node,std::allocator<Parser::Node>> *)&nowMid,&local_290,
                           &local_2b1);
                std::__cxx11::string::~string(local_2b0);
              }
            }
            else {
              __k = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)endTran_abi_cxx11_,
                                 (key_type *)
                                 &nowRule.rights.
                                  super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
              __args = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                     *)endToId_abi_cxx11_,__k);
              local_289 = true;
              std::vector<Parser::Node,std::allocator<Parser::Node>>::emplace_back<int&,bool>
                        ((vector<Parser::Node,std::allocator<Parser::Node>> *)&nowMid,__args,
                         &local_289);
            }
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&nowRule.rights.
                                        super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,"$");
            if (!bVar2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&i,"Parse Error",&local_2d9);
              ERROR((string *)&i);
              std::__cxx11::string::~string((string *)&i);
              std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
              poVar4 = std::operator<<((ostream *)&std::cerr,"Parse Error");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              goto LAB_0010b2c6;
            }
            pvVar8 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                               ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,
                                (long)local_268);
            std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::push_back
                      (&pvVar8->rules,(value_type *)&nowMid);
            std::vector<Parser::Node,_std::allocator<Parser::Node>_>::clear
                      ((vector<Parser::Node,_std::allocator<Parser::Node>_> *)&nowMid);
          }
        }
      }
    }
    eliPassRecur();
    eliCommonPreffix();
    eliNone();
    getFirstSet();
    getEndSet();
    getSelectSet();
    for (local_2e0 = 0;
        sVar7 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::size
                          ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids),
        (ulong)(long)local_2e0 < sVar7; local_2e0 = local_2e0 + 1) {
      pvVar8 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                         ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,(long)local_2e0)
      ;
      print(pvVar8);
    }
LAB_0010b2c6:
    Rule::~Rule((Rule *)&nowMid);
    std::__cxx11::string::~string
              ((string *)
               &nowRule.rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  iVar3 = std::ifstream::~ifstream(local_218);
  return iVar3;
}

Assistant:

void init(const string &fileName){
        getEnds();
        ifstream in;
        in.open(fileName);
        if(!in.is_open()){
            cerr<<"open "<<fileName<<" wrong"<<endl;
            return;
        }
        string nowString;
        Rule nowRule;
        int stat=0,nowMid=0;
        while(in>>nowString){
            if(nowString=="#"){
                stat = 0;
            }else if(nowString=="->"){
                stat = 1;
            }else if(stat==0){
                nowMid = addMid(nowString);
            }else if(nowString != "$"){
                if(endTran.count(nowString)){
                    nowRule.rights.emplace_back(endToId[endTran[nowString]],true);
                }else if(nowString == "none"){
                    mids[nowMid].canNone = true;
                }else{
                    nowRule.rights.emplace_back(addMid(nowString),false);
                }
            }else if(nowString == "$"){
                mids[nowMid].rules.push_back(nowRule);
                nowRule.rights.clear();
            }else{
                ERROR("Parse Error");
                cerr<<"Parse Error"<<endl;
                return;
            }
        }
        eliPassRecur();
        eliCommonPreffix();
        eliNone();
        getFirstSet();
        getEndSet();
        getSelectSet();
        // for(int i = 0;i < mids.size();i++){
        //     cout<<mids[i].sgn<<" -> ";
        //     for(auto t:mids[i].follow){
        //         cout<<ends[t]<<" ";
        //     }
        //     cout<<endl;
        // }
        for(int i = 0;i < mids.size();i++){
            print(mids[i]);
        }
    }